

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.cpp
# Opt level: O2

void __thiscall
btConeTwistConstraint::computeConeLimitInfo
          (btConeTwistConstraint *this,btQuaternion *qCone,btScalar *swingAngle,
          btVector3 *vSwingAxis,btScalar *swingLimit)

{
  float fVar1;
  undefined8 uVar2;
  btScalar bVar3;
  float fVar4;
  float fVar8;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  float fVar9;
  undefined1 auVar6 [16];
  
  bVar3 = btQuaternion::getAngle(qCone);
  *swingAngle = bVar3;
  if (1.1920929e-07 < bVar3) {
    bVar3 = (qCone->super_btQuadWord).m_floats[2];
    *(undefined8 *)vSwingAxis->m_floats = *(undefined8 *)(qCone->super_btQuadWord).m_floats;
    vSwingAxis->m_floats[2] = bVar3;
    vSwingAxis->m_floats[3] = 0.0;
    btVector3::normalize(vSwingAxis);
    uVar2 = *(undefined8 *)(vSwingAxis->m_floats + 1);
    fVar1 = this->m_swingSpan1;
    *swingLimit = fVar1;
    fVar4 = (float)uVar2;
    if (1.1920929e-07 < ABS(fVar4)) {
      fVar8 = (float)((ulong)uVar2 >> 0x20);
      fVar8 = fVar8 * fVar8;
      fVar9 = fVar8 / (fVar4 * fVar4);
      fVar4 = (this->m_swingAxis).m_floats[0];
      auVar6._0_8_ = (undefined8)DAT_001b24f0;
      auVar6._8_4_ = DAT_001b24f0._4_4_;
      auVar6._12_4_ = fVar8;
      auVar5._8_8_ = auVar6._8_8_;
      auVar5._0_4_ = (undefined4)DAT_001b24f0;
      auVar5._4_4_ = fVar9;
      auVar7._4_4_ = fVar1 * fVar1;
      auVar7._0_4_ = this->m_swingSpan2 * this->m_swingSpan2;
      auVar7._8_4_ = this->m_fixThresh * this->m_fixThresh;
      auVar7._12_4_ = fVar4 * fVar4;
      auVar7 = divps(auVar5,auVar7);
      *swingLimit = SQRT((fVar9 + 1.0) / (auVar7._4_4_ + auVar7._0_4_));
    }
  }
  return;
}

Assistant:

void btConeTwistConstraint::computeConeLimitInfo(const btQuaternion& qCone,
												 btScalar& swingAngle, // out
												 btVector3& vSwingAxis, // out
												 btScalar& swingLimit) // out
{
	swingAngle = qCone.getAngle();
	if (swingAngle > SIMD_EPSILON)
	{
		vSwingAxis = btVector3(qCone.x(), qCone.y(), qCone.z());
		vSwingAxis.normalize();
#if 0
        // non-zero twist?! this should never happen.
       btAssert(fabs(vSwingAxis.x()) <= SIMD_EPSILON));
#endif
        
		// Compute limit for given swing. tricky:
		// Given a swing axis, we're looking for the intersection with the bounding cone ellipse.
		// (Since we're dealing with angles, this ellipse is embedded on the surface of a sphere.)

		// For starters, compute the direction from center to surface of ellipse.
		// This is just the perpendicular (ie. rotate 2D vector by PI/2) of the swing axis.
		// (vSwingAxis is the cone rotation (in z,y); change vars and rotate to (x,y) coords.)
		btScalar xEllipse =  vSwingAxis.y();
		btScalar yEllipse = -vSwingAxis.z();

		// Now, we use the slope of the vector (using x/yEllipse) and find the length
		// of the line that intersects the ellipse:
		//  x^2   y^2
		//  --- + --- = 1, where a and b are semi-major axes 2 and 1 respectively (ie. the limits)
		//  a^2   b^2
		// Do the math and it should be clear.

		swingLimit = m_swingSpan1; // if xEllipse == 0, we have a pure vSwingAxis.z rotation: just use swingspan1
		if (fabs(xEllipse) > SIMD_EPSILON)
		{
			btScalar surfaceSlope2 = (yEllipse*yEllipse)/(xEllipse*xEllipse);
			btScalar norm = 1 / (m_swingSpan2 * m_swingSpan2);
			norm += surfaceSlope2 / (m_swingSpan1 * m_swingSpan1);
			btScalar swingLimit2 = (1 + surfaceSlope2) / norm;
			swingLimit = sqrt(swingLimit2);
		}

		// test!
		/*swingLimit = m_swingSpan2;
		if (fabs(vSwingAxis.z()) > SIMD_EPSILON)
		{
		btScalar mag_2 = m_swingSpan1*m_swingSpan1 + m_swingSpan2*m_swingSpan2;
		btScalar sinphi = m_swingSpan2 / sqrt(mag_2);
		btScalar phi = asin(sinphi);
		btScalar theta = atan2(fabs(vSwingAxis.y()),fabs(vSwingAxis.z()));
		btScalar alpha = 3.14159f - theta - phi;
		btScalar sinalpha = sin(alpha);
		swingLimit = m_swingSpan1 * sinphi/sinalpha;
		}*/
	}
	else if (swingAngle < 0)
	{
		// this should never happen!
#if 0
        btAssert(0);
#endif
 	}
}